

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int parse_rockridge(archive_read *a,file_info *file,uchar *p,uchar *end)

{
  uchar uVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  uchar *data_00;
  int32_t location;
  int version;
  int data_length;
  uchar *data;
  iso9660 *iso9660;
  uchar *end_local;
  uchar *p_local;
  file_info *file_local;
  archive_read *a_local;
  
  pvVar2 = a->format->data;
  end_local = p;
  while( true ) {
    bVar4 = false;
    if ((((end_local + 4 <= end) && (bVar4 = false, 0x40 < *end_local)) &&
        (bVar4 = false, *end_local < 0x5b)) &&
       (((bVar4 = false, 0x40 < end_local[1] && (bVar4 = false, end_local[1] < 0x5b)) &&
        (bVar4 = false, 3 < end_local[2])))) {
      bVar4 = end_local + (int)(uint)end_local[2] <= end;
    }
    if (!bVar4) break;
    data_00 = end_local + 4;
    iVar5 = end_local[2] - 4;
    uVar1 = end_local[3];
    switch(*end_local) {
    case 'C':
      if (end_local[1] == 'E') {
        if ((uVar1 == '\x01') && (iVar5 == 0x18)) {
          uVar6 = archive_le32dec(data_00);
          uVar7 = archive_le32dec(end_local + 0xc);
          file->ce_offset = uVar7;
          uVar7 = archive_le32dec(end_local + 0x14);
          file->ce_size = uVar7;
          iVar5 = register_CE(a,uVar6,file);
          if (iVar5 != 0) {
            return -0x1e;
          }
        }
      }
      else if (((end_local[1] == 'L') && (uVar1 == '\x01')) && (iVar5 == 8)) {
        lVar3 = *(long *)((long)pvVar2 + 0xa8);
        uVar6 = archive_le32dec(data_00);
        file->cl_offset = lVar3 * (ulong)uVar6;
        *(undefined1 *)((long)pvVar2 + 0x28) = 1;
      }
      break;
    default:
      break;
    case 'N':
      if ((end_local[1] == 'M') && (uVar1 == '\x01')) {
        parse_rockridge_NM1(file,data_00,iVar5);
        *(undefined1 *)((long)pvVar2 + 0x28) = 1;
      }
      break;
    case 'P':
      if (end_local[1] == 'N') {
        if ((uVar1 == '\x01') && (iVar5 == 0x10)) {
          uVar8 = toi(data_00,4);
          file->rdev = (ulong)uVar8;
          file->rdev = file->rdev << 0x20;
          uVar8 = toi(end_local + 0xc,4);
          file->rdev = (ulong)uVar8 | file->rdev;
          *(undefined1 *)((long)pvVar2 + 0x28) = 1;
        }
      }
      else if ((end_local[1] == 'X') && (uVar1 == '\x01')) {
        if (7 < iVar5) {
          uVar8 = toi(data_00,4);
          file->mode = uVar8;
        }
        if (0xf < iVar5) {
          uVar8 = toi(end_local + 0xc,4);
          file->nlinks = uVar8;
        }
        if (0x17 < iVar5) {
          uVar8 = toi(end_local + 0x14,4);
          file->uid = uVar8;
        }
        if (0x1f < iVar5) {
          uVar8 = toi(end_local + 0x1c,4);
          file->gid = uVar8;
        }
        if (0x27 < iVar5) {
          uVar8 = toi(end_local + 0x24,4);
          file->number = (ulong)uVar8;
        }
        *(undefined1 *)((long)pvVar2 + 0x28) = 1;
      }
      break;
    case 'R':
      if ((end_local[1] == 'E') && (uVar1 == '\x01')) {
        file->re = '\x01';
        *(undefined1 *)((long)pvVar2 + 0x28) = 1;
      }
      break;
    case 'S':
      if (end_local[1] == 'L') {
        if (uVar1 == '\x01') {
          parse_rockridge_SL1(file,data_00,iVar5);
          *(undefined1 *)((long)pvVar2 + 0x28) = 1;
        }
      }
      else if (((end_local[1] == 'T') && (iVar5 == 0)) && (uVar1 == '\x01')) {
        *(undefined1 *)((long)pvVar2 + 0x29) = 0;
        *(undefined1 *)((long)pvVar2 + 0x28) = 0;
        return 0;
      }
      break;
    case 'T':
      if ((end_local[1] == 'F') && (uVar1 == '\x01')) {
        parse_rockridge_TF1(file,data_00,iVar5);
        *(undefined1 *)((long)pvVar2 + 0x28) = 1;
      }
      break;
    case 'Z':
      if ((end_local[1] == 'F') && (uVar1 == '\x01')) {
        parse_rockridge_ZF1(file,data_00,iVar5);
      }
    }
    end_local = end_local + (int)(uint)end_local[2];
  }
  return 0;
}

Assistant:

static int
parse_rockridge(struct archive_read *a, struct file_info *file,
    const unsigned char *p, const unsigned char *end)
{
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	while (p + 4 <= end  /* Enough space for another entry. */
	    && p[0] >= 'A' && p[0] <= 'Z' /* Sanity-check 1st char of name. */
	    && p[1] >= 'A' && p[1] <= 'Z' /* Sanity-check 2nd char of name. */
	    && p[2] >= 4 /* Sanity-check length. */
	    && p + p[2] <= end) { /* Sanity-check length. */
		const unsigned char *data = p + 4;
		int data_length = p[2] - 4;
		int version = p[3];

		switch(p[0]) {
		case 'C':
			if (p[1] == 'E') {
				if (version == 1 && data_length == 24) {
					/*
					 * CE extension comprises:
					 *   8 byte sector containing extension
					 *   8 byte offset w/in above sector
					 *   8 byte length of continuation
					 */
					int32_t location =
					    archive_le32dec(data);
					file->ce_offset =
					    archive_le32dec(data+8);
					file->ce_size =
					    archive_le32dec(data+16);
					if (register_CE(a, location, file)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
			}
			else if (p[1] == 'L') {
				if (version == 1 && data_length == 8) {
					file->cl_offset = (uint64_t)
					    iso9660->logical_block_size *
					    (uint64_t)archive_le32dec(data);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'N':
			if (p[1] == 'M') {
				if (version == 1) {
					parse_rockridge_NM1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'P':
			/*
			 * PD extension is padding;
			 * contents are always ignored.
			 *
			 * PL extension won't appear;
			 * contents are always ignored.
			 */
			if (p[1] == 'N') {
				if (version == 1 && data_length == 16) {
					file->rdev = toi(data,4);
					file->rdev <<= 32;
					file->rdev |= toi(data + 8, 4);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'X') {
				/*
				 * PX extension comprises:
				 *   8 bytes for mode,
				 *   8 bytes for nlinks,
				 *   8 bytes for uid,
				 *   8 bytes for gid,
				 *   8 bytes for inode.
				 */
				if (version == 1) {
					if (data_length >= 8)
						file->mode
						    = toi(data, 4);
					if (data_length >= 16)
						file->nlinks
						    = toi(data + 8, 4);
					if (data_length >= 24)
						file->uid
						    = toi(data + 16, 4);
					if (data_length >= 32)
						file->gid
						    = toi(data + 24, 4);
					if (data_length >= 40)
						file->number
						    = toi(data + 32, 4);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'R':
			if (p[1] == 'E' && version == 1) {
				file->re = 1;
				iso9660->seenRockridge = 1;
			}
			else if (p[1] == 'R' && version == 1) {
				/*
				 * RR extension comprises:
				 *    one byte flag value
				 * This extension is obsolete,
				 * so contents are always ignored.
				 */
			}
			break;
		case 'S':
			if (p[1] == 'L') {
				if (version == 1) {
					parse_rockridge_SL1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'T'
			    && data_length == 0 && version == 1) {
				/*
				 * ST extension marks end of this
				 * block of SUSP entries.
				 *
				 * It allows SUSP to coexist with
				 * non-SUSP uses of the System
				 * Use Area by placing non-SUSP data
				 * after SUSP data.
				 */
				iso9660->seenSUSP = 0;
				iso9660->seenRockridge = 0;
				return (ARCHIVE_OK);
			}
			break;
		case 'T':
			if (p[1] == 'F') {
				if (version == 1) {
					parse_rockridge_TF1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'Z':
			if (p[1] == 'F') {
				if (version == 1)
					parse_rockridge_ZF1(file,
					    data, data_length);
			}
			break;
		default:
			break;
		}

		p += p[2];
	}
	return (ARCHIVE_OK);
}